

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

int Sml_CompareMaxId(unsigned_short *pImp1,unsigned_short *pImp2)

{
  int iVar1;
  int iVar2;
  int Max2;
  int Max1;
  unsigned_short *pImp2_local;
  unsigned_short *pImp1_local;
  
  iVar1 = Abc_MaxInt((uint)*pImp1,(uint)pImp1[1]);
  iVar2 = Abc_MaxInt((uint)*pImp2,(uint)pImp2[1]);
  if (iVar1 < iVar2) {
    pImp1_local._4_4_ = -1;
  }
  else if (iVar2 < iVar1) {
    pImp1_local._4_4_ = 1;
  }
  else {
    pImp1_local._4_4_ = 0;
  }
  return pImp1_local._4_4_;
}

Assistant:

int Sml_CompareMaxId( unsigned short * pImp1, unsigned short * pImp2 )
{
    int Max1 = Abc_MaxInt( pImp1[0], pImp1[1] );
    int Max2 = Abc_MaxInt( pImp2[0], pImp2[1] );
    if ( Max1 < Max2 )
        return -1;
    if ( Max1 > Max2  )
        return 1;
    return 0; 
}